

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

ssize_t __thiscall Database::write(Database *this,int __fd,void *__buf,size_t __n)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  uint uVar5;
  int fd;
  char *pcVar6;
  undefined4 in_register_00000034;
  ushort uVar7;
  IndexData data;
  
  pthread_rwlock_wrlock((pthread_rwlock_t *)this);
  uVar3 = *(ulong *)((long)__buf + 8);
  uVar5 = this->metadata->currentOffset;
  uVar7 = (ushort)uVar3;
  if (uVar7 + uVar5 < 0x2000001) {
    pcVar6 = this->currentSlice;
  }
  else {
    fd = createNewSlice(this);
    mapSlice(this,fd,this->metadata->currentSliceNumber);
    pcVar6 = this->slices[this->metadata->currentSliceNumber];
    this->currentSlice = pcVar6;
    uVar5 = this->metadata->currentOffset;
  }
  memcpy(pcVar6 + uVar5,*__buf,uVar3 & 0xffff);
  uVar2 = this->metadata->currentSliceNumber;
  uVar4 = this->metadata->currentOffset;
  data.offset = uVar4;
  data.slice = uVar2;
  data.length._0_2_ = uVar7;
  data.length._2_2_ = 0;
  IndexTree::insert(this->index,(PolarString *)CONCAT44(in_register_00000034,__fd),data);
  puVar1 = &this->metadata->currentOffset;
  *puVar1 = *puVar1 + *(int *)((long)__buf + 8);
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return 0;
}

Assistant:

RetCode Database::write(const PolarString &key, const PolarString &value) {
    pthread_rwlock_wrlock(&rwlock);
//    printf("DB Shard %d write %s with %s\n", id, key.data(), value.data());
    auto data_length = (uint16_t) value.size();
    if (__glibc_unlikely(data_length + metadata->currentOffset > SLICE_SIZE)) {
        // use a new slice
        auto new_slice_fd = createNewSlice();
        mapSlice(new_slice_fd, metadata->currentSliceNumber);
        currentSlice = slices[metadata->currentSliceNumber];
    }
    memcpy(currentSlice + metadata->currentOffset, value.data(), data_length);
    index->insert(key, {(int32_t) metadata->currentSliceNumber, metadata->currentOffset, data_length});
    metadata->currentOffset += value.size();
    pthread_rwlock_unlock(&rwlock);
    return polar_race::kSucc;
}